

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcb_openssl.cpp
# Opt level: O1

void __thiscall MCrypto::Backend::Backend(Backend *this,AES_TYPE bits,MODE mode)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  InternalData *this_00;
  char *pcVar3;
  long *plVar4;
  undefined8 *puVar5;
  char *pcVar6;
  QByteArray local_c0;
  QByteArray local_a8;
  QByteArray local_90;
  QByteArray local_78;
  QByteArray local_60;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  this_00 = (InternalData *)operator_new(0x70);
  InternalData::InternalData(this_00);
  this->m = this_00;
  QMetaObject::indexOfEnumerator((char *)&staticMetaObject);
  local_38 = QMetaObject::enumerator(0x108d38);
  pcVar3 = (char *)QMetaEnum::valueToKey((int)local_38);
  QByteArray::QByteArray(&local_78,pcVar3,-1);
  plVar4 = (long *)QByteArray::replace((char)&local_78,'_');
  QByteArray::QByteArray(&local_90,"-",-1);
  local_c0.d.d = (Data *)*plVar4;
  local_c0.d.ptr = (char *)plVar4[1];
  local_c0.d.size = plVar4[2];
  if ((QArrayData *)local_c0.d.d != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)local_c0.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)local_c0.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  puVar5 = (undefined8 *)QByteArray::append(&local_c0);
  pQVar1 = (QArrayData *)*puVar5;
  pcVar3 = (char *)puVar5[1];
  qVar2 = puVar5[2];
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,1,8);
    }
  }
  QMetaObject::indexOfEnumerator((char *)&staticMetaObject);
  local_48 = QMetaObject::enumerator(0x108d38);
  pcVar6 = (char *)QMetaEnum::valueToKey((int)local_48);
  QByteArray::QByteArray(&local_a8,pcVar6,-1);
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c0.d.d = (Data *)pQVar1;
  local_c0.d.ptr = pcVar3;
  local_c0.d.size = qVar2;
  plVar4 = (long *)QByteArray::append(&local_c0);
  local_60.d.d = (Data *)*plVar4;
  local_60.d.ptr = (char *)plVar4[1];
  local_60.d.size = plVar4[2];
  if ((QArrayData *)local_60.d.d != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)local_60.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)local_60.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,1,8);
    }
  }
  QByteArray::operator=(&this->m->algorithm,&local_60);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,1,8);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,8);
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,1,8);
    }
  }
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,1,8);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,8);
    }
  }
  return;
}

Assistant:

MCrypto::Backend::Backend(MCrypto::AES_TYPE bits, MCrypto::MODE mode)
{
    m = new InternalData;
    m->algorithm = QByteArray(QMetaEnum::fromType<MCrypto::AES_TYPE>()
                                 .valueToKey(int(bits))).replace('_', '-')
                  + QByteArray("-")
                  + QByteArray(QMetaEnum::fromType<MCrypto::MODE>().valueToKey(int(mode)));
}